

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::ChSystem(ChSystem *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ChTimestepperEulerImplicitLinearized *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ChMaterialCompositionStrategy *pCVar3;
  undefined1 auVar4 [32];
  undefined1 local_39;
  ChTimestepperEulerImplicitLinearized *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  ChSystem *local_28;
  
  (this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable =
       (_func_int **)&PTR_GetNcoords_y_00b33ca8;
  ChAssembly::ChAssembly(&this->assembly);
  (this->G_acc).m_data[0] = 0.0;
  (this->contact_container).
  super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->contact_container).
  super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->G_acc).m_data[1] = -9.8;
  (this->G_acc).m_data[2] = 0.0;
  this->is_initialized = false;
  this->is_updated = false;
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  this->ncoords = auVar4._0_4_;
  this->ndoc = auVar4._4_4_;
  this->nsysvars = auVar4._8_4_;
  this->ncoords_w = auVar4._12_4_;
  this->ndoc_w = auVar4._16_4_;
  this->nsysvars_w = auVar4._20_4_;
  this->ndof = auVar4._24_4_;
  this->ndoc_w_C = auVar4._28_4_;
  this->ncoords_w = auVar4._0_4_;
  this->ndoc_w = auVar4._4_4_;
  this->nsysvars_w = auVar4._8_4_;
  this->ndof = auVar4._12_4_;
  this->ndoc_w_C = auVar4._16_4_;
  this->ndoc_w_D = auVar4._20_4_;
  this->ch_time = (double)auVar4._24_8_;
  this->step = 0.04;
  this->step_min = 0.002;
  this->step_max = 0.04;
  this->tol_force = -1.0;
  this->maxiter = 6;
  this->use_sleeping = false;
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  this->descriptor = (shared_ptr<chrono::ChSystemDescriptor>)auVar4._0_16_;
  this->solver = (shared_ptr<chrono::ChSolver>)auVar4._16_16_;
  this->min_bounce_speed = 0.15;
  this->max_penetration_recovery_speed = 0.6;
  this->stepcount = 0;
  this->setupcount = 0;
  this->solvecount = 0;
  this->write_matrix = false;
  (this->output_dir)._M_dataplus._M_p = (pointer)&(this->output_dir).field_2;
  (this->output_dir)._M_string_length = 0;
  (this->output_dir).field_2._M_local_buf[0] = '\0';
  this->ncontacts = 0;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collision_system = (shared_ptr<chrono::collision::ChCollisionSystem>)auVar4._0_16_;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar4._16_8_;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar4._24_8_;
  pCVar3 = (ChMaterialCompositionStrategy *)::operator_new(8);
  pCVar3->_vptr_ChMaterialCompositionStrategy =
       (_func_int **)&PTR__ChMaterialCompositionStrategy_00b33f90;
  (this->composition_strategy)._M_t.
  super___uniq_ptr_impl<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_chrono::ChMaterialCompositionStrategy_*,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
  .super__Head_base<0UL,_chrono::ChMaterialCompositionStrategy_*,_false>._M_head_impl = pCVar3;
  this->visual_system = (ChVisualSystem *)0x0;
  this->nthreads_chrono = 1;
  this->nthreads_eigen = 1;
  this->nthreads_collision = 1;
  (this->timer_step).m_start.__d.__r = 0;
  (this->timer_step).m_end.__d.__r = 0;
  (this->timer_advance).m_start.__d.__r = 0;
  (this->timer_advance).m_end.__d.__r = 0;
  (this->timer_ls_solve).m_start.__d.__r = 0;
  (this->timer_ls_solve).m_end.__d.__r = 0;
  (this->timer_ls_setup).m_start.__d.__r = 0;
  (this->timer_ls_setup).m_end.__d.__r = 0;
  (this->timer_jacobian).m_start.__d.__r = 0;
  (this->timer_jacobian).m_end.__d.__r = 0;
  (this->timer_collision).m_start.__d.__r = 0;
  (this->timer_collision).m_end.__d.__r = 0;
  (this->timer_setup).m_start.__d.__r = 0;
  (this->timer_setup).m_end.__d.__r = 0;
  (this->timer_update).m_start.__d.__r = 0;
  (this->timer_update).m_end.__d.__r = 0;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->last_err = false;
  (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  this->applied_forces_current = false;
  (this->assembly).super_ChPhysicsItem.system = this;
  this->collision_system_type = BULLET;
  collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.03);
  collision::ChCollisionModel::SetDefaultSuggestedMargin(0.01);
  local_38 = (ChTimestepperEulerImplicitLinearized *)0x0;
  local_28 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChTimestepperEulerImplicitLinearized,std::allocator<chrono::ChTimestepperEulerImplicitLinearized>,chrono::ChSystem*>
            (&_Stack_30,&local_38,
             (allocator<chrono::ChTimestepperEulerImplicitLinearized> *)&local_39,&local_28);
  _Var2._M_pi = _Stack_30._M_pi;
  pCVar1 = local_38;
  local_38 = (ChTimestepperEulerImplicitLinearized *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->timestepper).
            super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pCVar1;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

ChSystem::ChSystem()
    : G_acc(ChVector<>(0, -9.8, 0)),
      is_initialized(false),
      is_updated(false),
      ncoords(0),
      ndoc(0),
      nsysvars(0),
      ncoords_w(0),
      ndoc_w(0),
      nsysvars_w(0),
      ndof(0),
      ndoc_w_C(0),
      ndoc_w_D(0),
      ch_time(0),
      step(0.04),
      step_min(0.002),
      step_max(0.04),
      tol_force(-1),
      maxiter(6),
      use_sleeping(false),
      min_bounce_speed(0.15),
      max_penetration_recovery_speed(0.6),
      stepcount(0),
      setupcount(0),
      solvecount(0),
      write_matrix(false),
      ncontacts(0),
      composition_strategy(new ChMaterialCompositionStrategy),
      visual_system(nullptr),
      nthreads_chrono(ChOMP::GetNumProcs()),
      nthreads_eigen(1),
      nthreads_collision(1),
      last_err(false),
      applied_forces_current(false) {
    assembly.system = this;

    // Set default collision engine type, collision envelope, and margin.
    collision_system_type = collision::ChCollisionSystemType::BULLET;
    collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.03);
    collision::ChCollisionModel::SetDefaultSuggestedMargin(0.01);

    // Set default timestepper.
    timestepper = chrono_types::make_shared<ChTimestepperEulerImplicitLinearized>(this);
}